

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O3

bool cmVariableWatchCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *variable;
  string *psVar1;
  cmMakefile *this;
  pointer pcVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  undefined1 *client_data;
  cmake *pcVar6;
  undefined8 *puVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string command;
  _Manager_type *local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  _Invoker_type p_Stack_b0;
  string local_a8;
  undefined1 local_88 [16];
  _Manager_type local_78;
  _Invoker_type p_Stack_70;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  __uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  variable = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (variable == psVar1) {
    local_88._0_8_ = &local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"must be called with at least one argument.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((_Manager_type *)local_88._0_8_ != &local_78) {
      operator_delete((void *)local_88._0_8_,(ulong)(local_78 + 1));
    }
    return false;
  }
  local_38 = 0;
  local_30 = 0;
  local_40 = &local_30;
  if (0x20 < (ulong)((long)psVar1 - (long)variable)) {
    std::__cxx11::string::_M_assign((string *)&local_40);
  }
  iVar5 = std::__cxx11::string::compare((char *)variable);
  if (iVar5 == 0) {
    p_Stack_70 = (_Invoker_type)(variable->_M_dataplus)._M_p;
    local_78 = (_Manager_type)variable->_M_string_length;
    local_88._0_8_ = (pointer)0x1f;
    local_88._8_8_ = "cannot be set on the variable: ";
    views._M_len = 2;
    views._M_array = (iterator)local_88;
    cmCatViews_abi_cxx11_(&local_a8,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  else {
    client_data = (undefined1 *)operator_new(0x28);
    *(undefined1 **)(client_data + 8) = client_data + 0x18;
    *(undefined8 *)(client_data + 0x10) = 0;
    client_data[0x18] = 0;
    *client_data = 0;
    std::__cxx11::string::operator=((string *)(client_data + 8),(string *)&local_40);
    pcVar6 = cmMakefile::GetCMakeInstance(status->Makefile);
    bVar4 = cmVariableWatch::AddWatch
                      ((pcVar6->VariableWatch)._M_t.
                       super___uniq_ptr_impl<cmVariableWatch,_std::default_delete<cmVariableWatch>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmVariableWatch_*,_std::default_delete<cmVariableWatch>_>
                       .super__Head_base<0UL,_cmVariableWatch_*,_false>._M_head_impl,variable,
                       anon_unknown.dwarf_d38e54::cmVariableWatchCommandVariableAccessed,client_data
                       ,anon_unknown.dwarf_d38e54::deleteVariableWatchCallbackData);
    if (bVar4) {
      this = status->Makefile;
      pcVar2 = (variable->_M_dataplus)._M_p;
      local_c8 = (_Manager_type *)&local_b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar2,pcVar2 + variable->_M_string_length);
      puVar7 = (undefined8 *)operator_new(0x38);
      uVar3 = local_c0;
      puVar7[1] = 0x100000001;
      *puVar7 = &PTR___Sp_counted_ptr_inplace_009a26b0;
      if (local_c8 == (_Manager_type *)&local_b8) {
        p_Stack_70 = p_Stack_b0;
        local_c8 = &local_78;
      }
      local_78 = (_Manager_type)CONCAT71(uStack_b7,local_b8);
      local_c0 = 0;
      local_b8 = 0;
      puVar7[2] = this;
      puVar7[3] = puVar7 + 5;
      if (local_c8 == &local_78) {
        puVar7[5] = local_78;
        puVar7[6] = p_Stack_70;
      }
      else {
        puVar7[3] = local_c8;
        puVar7[5] = local_78;
      }
      puVar7[4] = uVar3;
      local_a8._M_string_length = 0;
      local_c8 = (_Manager_type *)&local_b8;
      local_a8._M_dataplus._M_p = (pointer)operator_new(0x10);
      *(undefined8 **)local_a8._M_dataplus._M_p = puVar7 + 2;
      *(undefined8 **)(local_a8._M_dataplus._M_p + 8) = puVar7;
      p_Stack_70 = std::
                   _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(anonymous_namespace)::FinalAction>
                   ::_M_invoke;
      local_88._8_8_ = local_a8._M_string_length;
      local_78 = std::
                 _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(anonymous_namespace)::FinalAction>
                 ::_M_manager;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8.field_2._8_8_ = 0;
      local_58 = (_Manager_type)0x0;
      p_Stack_50 = (_Invoker_type)0x0;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      local_48._M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
      .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
           (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
           (_Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)0x0;
      local_88._0_8_ = local_a8._M_dataplus._M_p;
      cmMakefile::AddGeneratorAction(this,(GeneratorAction *)local_88);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_48);
      if (local_58 != (_Manager_type)0x0) {
        (*local_58)(&local_68,&local_68,__destroy_functor);
      }
      if (local_78 != (_Manager_type)0x0) {
        (*local_78)((_Any_data *)local_88,(_Any_data *)local_88,__destroy_functor);
      }
      if ((code *)local_a8.field_2._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_a8.field_2._M_allocated_capacity)(&local_a8,&local_a8,3);
      }
      bVar4 = true;
      if (local_c8 != (_Manager_type *)&local_b8) {
        operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
      }
      goto LAB_002d398d;
    }
    anon_unknown.dwarf_d38e54::deleteVariableWatchCallbackData(client_data);
  }
  bVar4 = false;
LAB_002d398d:
  if (local_40 != &local_30) {
    operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
  }
  return bVar4;
}

Assistant:

bool cmVariableWatchCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("must be called with at least one argument.");
    return false;
  }
  std::string const& variable = args[0];
  std::string command;
  if (args.size() > 1) {
    command = args[1];
  }
  if (variable == "CMAKE_CURRENT_LIST_FILE") {
    status.SetError(cmStrCat("cannot be set on the variable: ", variable));
    return false;
  }

  auto* const data = new cmVariableWatchCallbackData;

  data->InCallback = false;
  data->Command = std::move(command);

  if (!status.GetMakefile().GetCMakeInstance()->GetVariableWatch()->AddWatch(
        variable, cmVariableWatchCommandVariableAccessed, data,
        deleteVariableWatchCallbackData)) {
    deleteVariableWatchCallbackData(data);
    return false;
  }

  status.GetMakefile().AddGeneratorAction(
    FinalAction{ &status.GetMakefile(), variable });
  return true;
}